

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  byte bVar1;
  byte bVar2;
  global_State *pgVar3;
  GCObject *o;
  byte bVar4;
  byte bVar5;
  GCObject **local_58;
  int marked;
  GCObject *curr;
  int tostop;
  int toset;
  int toclear;
  int ow;
  global_State *g;
  lu_mem count_local;
  GCObject **p_local;
  lua_State *L_local;
  
  pgVar3 = L->l_G;
  bVar1 = pgVar3->currentwhite;
  g = (global_State *)count;
  if (pgVar3->gckind == '\x02') {
    tostop._0_1_ = 0xff;
    bVar5 = 0x40;
    bVar4 = 0x40;
    count_local = (lu_mem)p;
  }
  else {
    tostop._0_1_ = 0xb8;
    bVar5 = pgVar3->currentwhite & 3;
    bVar4 = 0;
    count_local = (lu_mem)p;
  }
  while( true ) {
    pgVar3 = g;
    if (*(long *)count_local != 0) {
      g = (global_State *)((long)g[-1].mt + 0x47);
    }
    if (*(long *)count_local == 0 || pgVar3 == (global_State *)0x0) break;
    o = *(GCObject **)count_local;
    bVar2 = (o->gch).marked;
    if ((byte)((bVar2 ^ 3) & (bVar1 ^ 3)) == 0) {
      *(GCObject **)count_local = (o->gch).next;
      freeobj(L,o);
    }
    else {
      if ((bVar2 & bVar4) != 0) {
        return (GCObject **)0x0;
      }
      if ((o->gch).tt == '\b') {
        sweepthread(L,&o->th);
      }
      (o->gch).marked = bVar2 & (byte)tostop | bVar5;
      count_local = (lu_mem)o;
    }
  }
  if (*(long *)count_local == 0) {
    local_58 = (GCObject **)0x0;
  }
  else {
    local_58 = (GCObject **)count_local;
  }
  return local_58;
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, lu_mem count) {
  global_State *g = G(L);
  int ow = otherwhite(g);
  int toclear, toset;  /* bits to clear and to set in all live objects */
  int tostop;  /* stop sweep when this is true */
  if (isgenerational(g)) {  /* generational mode? */
    toclear = ~0;  /* clear nothing */
    toset = bitmask(OLDBIT);  /* set the old bit of all surviving objects */
    tostop = bitmask(OLDBIT);  /* do not sweep old generation */
  }
  else {  /* normal mode */
    toclear = maskcolors;  /* clear all color bits + old bit */
    toset = luaC_white(g);  /* make object white */
    tostop = 0;  /* do not stop */
  }
  while (*p != NULL && count-- > 0) {
    GCObject *curr = *p;
    int marked = gch(curr)->marked;
    if (isdeadm(ow, marked)) {  /* is 'curr' dead? */
      *p = gch(curr)->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {
      if (testbits(marked, tostop))
        return NULL;  /* stop sweeping this list */
      if (gch(curr)->tt == LUA_TTHREAD)
        sweepthread(L, gco2th(curr));  /* sweep thread's upvalues */
      /* update marks */
      gch(curr)->marked = cast_byte((marked & toclear) | toset);
      p = &gch(curr)->next;  /* go to next element */
    }
  }
  return (*p == NULL) ? NULL : p;
}